

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O3

void __thiscall
re2c::DFA::count_used_labels
          (DFA *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used,
          label_t start,label_t initial,bool force_start)

{
  bool bVar1;
  opt_t *poVar2;
  pointer ppSVar3;
  const_iterator cVar4;
  ulong uVar5;
  ulong uVar6;
  State *pSVar7;
  label_t local_2c;
  label_t local_28;
  label_t local_24;
  
  local_2c.value = initial.value;
  local_28.value = start.value;
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (poVar2->fFlag == true) {
    local_24 = label_t::first();
    std::
    _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
    ::_M_insert_unique<re2c::label_t>(&used->_M_t,&local_24);
  }
  if (force_start) {
    std::
    _Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
    ::_M_insert_unique<re2c::label_t_const&>
              ((_Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
                *)used,&local_28);
  }
  for (pSVar7 = this->head; pSVar7 != (State *)0x0; pSVar7 = pSVar7->next) {
    Go::used_labels(&pSVar7->go,used);
  }
  ppSVar3 = (this->accepts).elems.
            super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->accepts).elems.
      super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar3) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      std::
      _Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
      ::_M_insert_unique<re2c::label_t_const&>
                ((_Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
                  *)used,&ppSVar3[uVar5]->label);
      ppSVar3 = (this->accepts).elems.
                super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar6 < (ulong)((long)(this->accepts).elems.
                                    super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3)
      ;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  cVar4 = std::
          _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
          ::find(&used->_M_t,&this->head->label);
  if ((_Rb_tree_header *)cVar4._M_node != &(used->_M_t)._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
    ::_M_insert_unique<re2c::label_t_const&>
              ((_Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
                *)used,&local_2c);
  }
  return;
}

Assistant:

void DFA::count_used_labels (std::set<label_t> & used, label_t start, label_t initial, bool force_start) const
{
	// In '-f' mode, default state is always state 0
	if (opts->fFlag)
	{
		used.insert (label_t::first ());
	}
	if (force_start)
	{
		used.insert (start);
	}
	for (State * s = head; s; s = s->next)
	{
		s->go.used_labels (used);
	}
	for (uint32_t i = 0; i < accepts.size (); ++i)
	{
		used.insert (accepts[i]->label);
	}
	// must go last: it needs the set of used labels
	if (used.count (head->label))
	{
		used.insert (initial);
	}
}